

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_keyless_list_hash_change(lyd_node *parent)

{
  int iVar1;
  bool bVar2;
  lyd_node *plStack_10;
  int r;
  lyd_node *parent_local;
  
  plStack_10 = parent;
  do {
    bVar2 = false;
    if (plStack_10 != (lyd_node *)0x0) {
      bVar2 = (plStack_10->schema->flags & 1) == 0;
    }
    if (!bVar2) {
      return;
    }
    if (plStack_10->schema->nodetype == LYS_LIST) {
      if ((plStack_10->hash == 0) || (plStack_10->schema->padding[2] != '\0')) {
        iVar1 = lyd_list_has_keys(plStack_10);
        if (iVar1 == 0) {
          return;
        }
      }
      else {
        if (((plStack_10->parent != (lyd_node *)0x0) &&
            (plStack_10->parent->ht != (hash_table *)0x0)) &&
           (iVar1 = lyht_remove(plStack_10->parent->ht,&stack0xfffffffffffffff0,plStack_10->hash),
           iVar1 != 0)) {
          __assert_fail("!r",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x187,"void lyd_keyless_list_hash_change(struct lyd_node *)");
        }
        lyd_hash(plStack_10);
        if (((plStack_10->parent != (lyd_node *)0x0) &&
            (plStack_10->parent->ht != (hash_table *)0x0)) &&
           (iVar1 = lyht_insert(plStack_10->parent->ht,&stack0xfffffffffffffff0,plStack_10->hash,
                                (void **)0x0), iVar1 != 0)) {
          __assert_fail("!r",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,399,"void lyd_keyless_list_hash_change(struct lyd_node *)");
        }
      }
    }
    plStack_10 = plStack_10->parent;
  } while( true );
}

Assistant:

static void
lyd_keyless_list_hash_change(struct lyd_node *parent)
{
    int r;

    while (parent && !(parent->schema->flags & LYS_CONFIG_W)) {
        if (parent->schema->nodetype == LYS_LIST) {
            if (parent->hash && !((struct lys_node_list *)parent->schema)->keys_size) {
                if (parent->parent && parent->parent->ht) {
                    /* remove the list from the parent */
                    r = lyht_remove(parent->parent->ht, &parent, parent->hash);
                    assert(!r);
                    (void)r;
                }
                /* recalculate the hash */
                lyd_hash(parent);
                if (parent->parent && parent->parent->ht) {
                    /* re-add the list again */
                    r = lyht_insert(parent->parent->ht, &parent, parent->hash, NULL);
                    assert(!r);
                    (void)r;
                }
            } else if (!lyd_list_has_keys(parent)) {
                /* a parent is a list without keys so it cannot be a part of any parent hash */
                break;
            }
        }

        parent = parent->parent;
    }
}